

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3PutVarint(uchar *p,u64 v)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  uchar auStack_14 [2];
  byte abStack_12 [10];
  long lStack_8;
  
  bVar5 = (byte)v;
  if (v < 0x80) {
    *p = bVar5;
    return 1;
  }
  if (0x3fff < v) {
    lStack_8 = *(long *)(in_FS_OFFSET + 0x28);
    if (v >> 0x38 == 0) {
      lVar2 = 0;
      do {
        lVar3 = lVar2;
        auStack_14[lVar3 + 2] = (byte)v | 0x80;
        lVar2 = lVar3 + 1;
        bVar1 = 0x7f < v;
        v = v >> 7;
      } while (bVar1);
      abStack_12[0] = abStack_12[0] & 0x7f;
      lVar3 = lVar3 + 2;
      lVar4 = lVar2;
      do {
        *p = auStack_14[lVar3];
        p = p + 1;
        lVar3 = lVar3 + -1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    else {
      p[8] = bVar5;
      uVar6 = v >> 8;
      lVar2 = 8;
      do {
        p[lVar2 + -1] = (byte)uVar6 | 0x80;
        uVar6 = uVar6 >> 7;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
      lVar2 = 9;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != lStack_8) {
      __stack_chk_fail();
    }
    return (int)lVar2;
  }
  *p = (byte)(v >> 7) | 0x80;
  p[1] = bVar5 & 0x7f;
  return 2;
}

Assistant:

SQLITE_PRIVATE int sqlite3PutVarint(unsigned char *p, u64 v){
  if( v<=0x7f ){
    p[0] = v&0x7f;
    return 1;
  }
  if( v<=0x3fff ){
    p[0] = ((v>>7)&0x7f)|0x80;
    p[1] = v&0x7f;
    return 2;
  }
  return putVarint64(p,v);
}